

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<double_const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<double_const&> *this,int *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  lest *this_00;
  size_type sVar2;
  char *pcVar3;
  int *in_R8;
  long *local_e0;
  undefined8 local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  undefined8 uStack_c8;
  string local_c0;
  long local_a0;
  long *local_98;
  undefined8 local_90;
  long local_88;
  undefined8 uStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  bool local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  this_00 = *(lest **)this;
  local_a0 = -(ulong)((double)*rhs != *(double *)this_00);
  local_e0 = (long *)&local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"!=","");
  if (local_e0 == (long *)&local_d0) {
    uStack_80 = uStack_c8;
    local_98 = &local_88;
  }
  else {
    local_98 = local_e0;
  }
  local_88 = CONCAT71(uStack_cf,local_d0);
  local_90 = local_d8;
  local_d8 = 0;
  local_d0 = 0;
  local_e0 = (long *)&local_d0;
  to_string<double,int>(&local_c0,this_00,(double *)&local_98,(string *)rhs,in_R8);
  sVar2 = local_c0._M_string_length;
  local_58 = (bool)((byte)local_a0 & 1);
  paVar1 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == paVar1) {
    local_68._8_8_ = local_c0.field_2._8_8_;
    local_c0._M_dataplus._M_p = (pointer)&local_68;
  }
  local_68._M_allocated_capacity._1_7_ = local_c0.field_2._M_allocated_capacity._1_7_;
  local_68._M_local_buf[0] = local_c0.field_2._M_local_buf[0];
  local_70 = local_c0._M_string_length;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  pcVar3 = local_c0._M_dataplus._M_p + sVar2;
  local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_c0._M_dataplus._M_p;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_78,pcVar3);
  __return_storage_ptr__->passed = local_58;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_50,local_48 + (long)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_e0 != (long *)&local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }